

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cl_parser.cpp
# Opt level: O2

void __thiscall ClParser_Enum_Test::ClParser_Enum_Test(ClParser_Enum_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00197db8;
  return;
}

Assistant:

TEST (ClParser, Enum) {
    using pstore::maybe;
    using pstore::command_line::parser;

    enum color { red, blue, green };
    parser<color> p;
    p.add_literal_option ("red", red, "description red");
    p.add_literal_option ("blue", blue, "description blue");
    p.add_literal_option ("green", green, "description green");
    {
        maybe<color> r1 = p ("red");
        EXPECT_TRUE (r1.has_value ());
        EXPECT_EQ (r1.value (), red);
    }
    {
        maybe<color> r2 = p ("blue");
        EXPECT_TRUE (r2.has_value ());
        EXPECT_EQ (r2.value (), blue);
    }
    {
        maybe<color> r3 = p ("green");
        EXPECT_TRUE (r3.has_value ());
        EXPECT_EQ (r3.value (), green);
    }
    {
        maybe<color> r4 = p ("bad");
        EXPECT_FALSE (r4.has_value ());
    }
    {
        maybe<color> r5 = p ("");
        EXPECT_FALSE (r5.has_value ());
    }
}